

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O3

int ddJumpingAux(DdManager *table,int x,int x_low,int x_high,double temp)

{
  int iVar1;
  int iVar2;
  DdHalfWord DVar3;
  DdHalfWord DVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int size;
  
  size = table->keys - table->isolated;
  iVar1 = cuddNextLow(table,x);
  iVar2 = cuddNextHigh(table,x);
  if (iVar1 < x_low) {
    if (x_high < iVar2) {
      return 1;
    }
    DVar3 = cuddNextHigh(table,x);
    if (x_high < (int)DVar3) {
      return 0;
    }
    pDVar6 = (DdNode *)0x0;
    iVar1 = size;
    do {
      iVar2 = cuddSwapInPlace(table,x,DVar3);
      if ((iVar2 == 0) || (pDVar5 = cuddDynamicAllocNode(table), pDVar5 == (DdNode *)0x0)) {
        if (pDVar6 == (DdNode *)0x0) {
          return 0;
        }
        pDVar5 = table->nextFree;
        do {
          pDVar7 = pDVar6;
          pDVar6 = (pDVar7->type).kids.T;
          pDVar7->ref = 0;
          pDVar7->next = pDVar5;
          pDVar5 = pDVar7;
        } while (pDVar6 != (DdNode *)0x0);
LAB_007c4f2e:
        table->nextFree = pDVar7;
        return 0;
      }
      pDVar5->index = x;
      pDVar5->ref = DVar3;
      *(int *)((long)&pDVar5->next + 4) = iVar2;
      (pDVar5->type).kids.T = pDVar6;
      if ((double)iVar1 * table->maxGrowth < (double)iVar2) break;
      if (iVar2 < iVar1) {
        iVar1 = iVar2;
      }
      DVar4 = cuddNextHigh(table,DVar3);
      pDVar6 = pDVar5;
      x = DVar3;
      DVar3 = DVar4;
    } while ((int)DVar4 <= x_high);
  }
  else {
    if (iVar2 <= x_high) {
      fwrite("Unexpected condition in ddJumping\n",0x22,1,(FILE *)table->err);
      return 0;
    }
    DVar3 = cuddNextLow(table,x);
    if ((int)DVar3 < x_low) {
      return 0;
    }
    pDVar6 = (DdNode *)0x0;
    iVar1 = size;
    do {
      iVar2 = cuddSwapInPlace(table,DVar3,x);
      if ((iVar2 == 0) || (pDVar5 = cuddDynamicAllocNode(table), pDVar5 == (DdNode *)0x0)) {
        if (pDVar6 == (DdNode *)0x0) {
          return 0;
        }
        pDVar5 = table->nextFree;
        do {
          pDVar7 = pDVar6;
          pDVar6 = (pDVar7->type).kids.T;
          pDVar7->ref = 0;
          pDVar7->next = pDVar5;
          pDVar5 = pDVar7;
        } while (pDVar6 != (DdNode *)0x0);
        goto LAB_007c4f2e;
      }
      pDVar5->index = DVar3;
      pDVar5->ref = x;
      *(int *)((long)&pDVar5->next + 4) = iVar2;
      (pDVar5->type).kids.T = pDVar6;
      if ((double)iVar1 * table->maxGrowth < (double)iVar2) break;
      if (iVar2 < iVar1) {
        iVar1 = iVar2;
      }
      DVar4 = cuddNextLow(table,DVar3);
      pDVar6 = pDVar5;
      x = DVar3;
      DVar3 = DVar4;
    } while (x_low <= (int)DVar4);
  }
  iVar1 = siftBackwardProb(table,(Move *)pDVar5,size,temp);
  if (iVar1 == 0) {
    pDVar6 = table->nextFree;
    do {
      pDVar7 = pDVar5;
      pDVar5 = (pDVar7->type).kids.T;
      pDVar7->ref = 0;
      pDVar7->next = pDVar6;
      pDVar6 = pDVar7;
    } while (pDVar5 != (DdNode *)0x0);
    table->nextFree = pDVar7;
    return 0;
  }
  pDVar6 = table->nextFree;
  do {
    pDVar7 = pDVar5;
    pDVar5 = (pDVar7->type).kids.T;
    pDVar7->ref = 0;
    pDVar7->next = pDVar6;
    pDVar6 = pDVar7;
  } while (pDVar5 != (DdNode *)0x0);
  table->nextFree = pDVar7;
  return 1;
}

Assistant:

static int
ddJumpingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high,
  double  temp)
{
    Move       *move;
    Move       *moves;        /* list of moves */
    int        initial_size;
    int        result;

    initial_size = table->keys - table->isolated;

#ifdef DD_DEBUG
    assert(table->subtables[x].keys > 0);
#endif

    moves = NULL;

    if (cuddNextLow(table,x) < x_low) {
        if (cuddNextHigh(table,x) > x_high) return(1);
        moves = ddJumpingDown(table,x,x_high,initial_size);
        /* after that point x --> x_high unless early termination */
        if (moves == NULL) goto ddJumpingAuxOutOfMem;
        /* move backward and stop at best position or accept uphill move */
        result = siftBackwardProb(table,moves,initial_size,temp);
        if (!result) goto ddJumpingAuxOutOfMem;
    } else if (cuddNextHigh(table,x) > x_high) {
        moves = ddJumpingUp(table,x,x_low,initial_size);
        /* after that point x --> x_low unless early termination */
        if (moves == NULL) goto ddJumpingAuxOutOfMem;
        /* move backward and stop at best position or accept uphill move */
        result = siftBackwardProb(table,moves,initial_size,temp);
        if (!result) goto ddJumpingAuxOutOfMem;
    } else {
        (void) fprintf(table->err,"Unexpected condition in ddJumping\n");
        goto ddJumpingAuxOutOfMem;
    }
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(1);

ddJumpingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}